

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_torn_write.cpp
# Opt level: O0

void TruncateWAL(FileSystem *fs,string *path,idx_t new_size)

{
  type pFVar1;
  undefined8 in_RDX;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *in_RSI;
  long *in_RDI;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> handle;
  optional_ptr<duckdb::FileOpener,_true> local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_20 [8];
  undefined8 local_18;
  long *local_8;
  
  local_38 = duckdb::FileFlags::FILE_FLAGS_WRITE;
  uStack_30 = _RegisterSubSystem;
  local_18 = in_RDX;
  local_8 = in_RDI;
  duckdb::optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_40,(FileOpener *)0x0);
  (**(code **)(*in_RDI + 0x10))(local_20,in_RDI,in_RSI,local_38,uStack_30,local_40.ptr);
  pFVar1 = duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
           operator*(in_RSI);
  (**(code **)(*local_8 + 0x60))(local_8,pFVar1,local_18);
  duckdb::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
             0x7b159d);
  return;
}

Assistant:

static void TruncateWAL(FileSystem &fs, const string &path, idx_t new_size) {
	auto handle = fs.OpenFile(path, FileFlags::FILE_FLAGS_WRITE);
	fs.Truncate(*handle, new_size);
}